

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O3

void push_job(parse_t *ps)

{
  code *pcVar1;
  size_t sVar2;
  pmtr_t *ppVar3;
  ctor_f *pcVar4;
  uint uVar5;
  char *pcVar6;
  UT_array *pUVar7;
  job_t *pjVar8;
  uint uVar9;
  bool bVar10;
  
  if (ps->job->name == (char *)0x0) {
    utstring_printf(ps->em,"job has no name");
    ps->rc = -1;
  }
  else {
    if (ps->rc == -1) {
      return;
    }
    pjVar8 = ps->job;
    uVar5 = (pjVar8->cmdv).n;
    uVar9 = (pjVar8->cmdv).i + 1;
    if (uVar5 < uVar9) {
      do {
        bVar10 = uVar5 == 0;
        uVar5 = uVar5 * 2;
        if (bVar10) {
          uVar5 = 8;
        }
      } while (uVar5 < uVar9);
      (pjVar8->cmdv).n = uVar5;
      pcVar6 = (char *)realloc((pjVar8->cmdv).d,(ulong)uVar5 * (pjVar8->cmdv).icd.sz);
      pjVar8 = ps->job;
      (pjVar8->cmdv).d = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0010494a;
    }
    pcVar1 = (code *)(pjVar8->cmdv).icd.init;
    sVar2 = (pjVar8->cmdv).icd.sz;
    if (pcVar1 == (code *)0x0) {
      memset((pjVar8->cmdv).d + (pjVar8->cmdv).i * sVar2,0,sVar2);
    }
    else {
      (*pcVar1)();
    }
    pUVar7 = &ps->job->cmdv;
    pUVar7->i = pUVar7->i + 1;
    pUVar7 = ps->cfg->jobs;
    uVar5 = pUVar7->n;
    uVar9 = pUVar7->i + 1;
    if (uVar5 < uVar9) {
      do {
        bVar10 = uVar5 == 0;
        uVar5 = uVar5 * 2;
        if (bVar10) {
          uVar5 = 8;
        }
      } while (uVar5 < uVar9);
      pUVar7->n = uVar5;
      pcVar6 = (char *)realloc(pUVar7->d,(ulong)uVar5 * (pUVar7->icd).sz);
      ppVar3 = ps->cfg;
      ppVar3->jobs->d = pcVar6;
      if (pcVar6 == (char *)0x0) {
LAB_0010494a:
        exit(-1);
      }
      pUVar7 = ppVar3->jobs;
    }
    sVar2 = (pUVar7->icd).sz;
    uVar5 = pUVar7->i;
    pcVar4 = (pUVar7->icd).copy;
    pUVar7->i = uVar5 + 1;
    if (pcVar4 == (ctor_f *)0x0) {
      memcpy(pUVar7->d + uVar5 * sVar2,ps->job,sVar2);
    }
    else {
      (*pcVar4)(pUVar7->d + uVar5 * sVar2,ps->job);
    }
    job_fin(ps->job);
    pjVar8 = ps->job;
    memset(pjVar8,0,0x198);
    (pjVar8->cmdv).icd.sz = 8;
    (pjVar8->cmdv).icd.init = (undefined1 *)0x0;
    (pjVar8->cmdv).icd.copy = utarray_str_cpy;
    (pjVar8->cmdv).icd.dtor = utarray_str_dtor;
    (pjVar8->envv).icd.dtor = (undefined1 *)0x0;
    (pjVar8->envv).d = (char *)0x0;
    (pjVar8->envv).icd.init = (undefined1 *)0x0;
    (pjVar8->envv).icd.copy = (ctor_f *)0x0;
    (pjVar8->envv).i = 0;
    (pjVar8->envv).n = 0;
    (pjVar8->envv).icd.sz = 0;
    (pjVar8->envv).icd.copy = utarray_str_cpy;
    (pjVar8->envv).icd.dtor = utarray_str_dtor;
    (pjVar8->envv).icd.sz = 8;
    (pjVar8->envv).icd.init = (undefined1 *)0x0;
    (pjVar8->depv).icd.dtor = (undefined1 *)0x0;
    (pjVar8->depv).d = (char *)0x0;
    (pjVar8->depv).icd.init = (undefined1 *)0x0;
    (pjVar8->depv).icd.copy = (ctor_f *)0x0;
    (pjVar8->depv).i = 0;
    (pjVar8->depv).n = 0;
    (pjVar8->depv).icd.sz = 0;
    (pjVar8->depv).icd.copy = utarray_str_cpy;
    (pjVar8->depv).icd.dtor = utarray_str_dtor;
    (pjVar8->depv).icd.sz = 8;
    (pjVar8->depv).icd.init = (undefined1 *)0x0;
    (pjVar8->rlim).icd.dtor = (undefined1 *)0x0;
    (pjVar8->rlim).d = (char *)0x0;
    (pjVar8->rlim).icd.init = (undefined1 *)0x0;
    (pjVar8->rlim).icd.copy = (ctor_f *)0x0;
    (pjVar8->rlim).i = 0;
    (pjVar8->rlim).n = 0;
    (pjVar8->rlim).icd.sz = 0;
    (pjVar8->rlim).icd.copy = (ctor_f *)0x0;
    (pjVar8->rlim).icd.dtor = (undefined1 *)0x0;
    (pjVar8->rlim).icd.sz = 0x18;
    (pjVar8->rlim).icd.init = (undefined1 *)0x0;
    (pjVar8->cpuset).__bits[0xe] = 0;
    (pjVar8->cpuset).__bits[0xf] = 0;
    (pjVar8->cpuset).__bits[0xc] = 0;
    (pjVar8->cpuset).__bits[0xd] = 0;
    (pjVar8->cpuset).__bits[10] = 0;
    (pjVar8->cpuset).__bits[0xb] = 0;
    (pjVar8->cpuset).__bits[8] = 0;
    (pjVar8->cpuset).__bits[9] = 0;
    (pjVar8->cpuset).__bits[6] = 0;
    (pjVar8->cpuset).__bits[7] = 0;
    (pjVar8->cpuset).__bits[4] = 0;
    (pjVar8->cpuset).__bits[5] = 0;
    (pjVar8->cpuset).__bits[2] = 0;
    (pjVar8->cpuset).__bits[3] = 0;
    (pjVar8->cpuset).__bits[0] = 0;
    (pjVar8->cpuset).__bits[1] = 0;
    pjVar8->respawn = 1;
  }
  return;
}

Assistant:

void push_job(parse_t *ps) {

  /* final validation */
  if (!ps->job->name) {
      utstring_printf(ps->em, "job has no name");
      ps->rc = -1;
  }

  if (ps->rc == -1) return;

  /* okay. polish it off and copy it into the jobs */
  utarray_extend_back(&ps->job->cmdv); /* put NULL on end of argv */
  utarray_push_back(ps->cfg->jobs, ps->job);
  /* reset job for another parse */
  job_fin(ps->job); 
  job_ini(ps->job);
}